

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load-balance-collective.hpp
# Opt level: O1

void diy::detail::move_block(Master *master,MoveInfo *move_info)

{
  int iVar1;
  void *pvVar2;
  Link *pLVar3;
  BinaryBuffer *extraout_RDX;
  BinaryBuffer *extraout_RDX_00;
  Collection *__x;
  size_t sz;
  _Any_data local_a0;
  _Manager_type local_90;
  code *local_88;
  void *local_80;
  BinaryBuffer local_78;
  undefined8 local_70;
  vector<char,_std::allocator<char>_> vStack_68;
  undefined8 local_50;
  vector<diy::BinaryBlob,_std::allocator<diy::BinaryBlob>_> vStack_48;
  
  if (move_info->src_proc == move_info->dst_proc) {
    fmt::v7::print<char[79],,char>
              (_stderr,(char (*) [79])
                       "Error: move_block(): source and destination are same. This should not happen.\n"
              );
    abort();
  }
  iVar1 = (master->comm_).rank_;
  if (iVar1 == move_info->src_proc) {
    local_78._vptr_BinaryBuffer = (_func_int **)&PTR__MemoryBuffer_001c2738;
    local_70 = 0;
    vStack_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    vStack_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    vStack_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_50 = 0;
    vStack_48.super__Vector_base<diy::BinaryBlob,_std::allocator<diy::BinaryBlob>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    vStack_48.super__Vector_base<diy::BinaryBlob,_std::allocator<diy::BinaryBlob>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_48.super__Vector_base<diy::BinaryBlob,_std::allocator<diy::BinaryBlob>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    iVar1 = Master::lid(master,move_info->move_gid);
    pvVar2 = (master->blocks_).elements_.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl
             .super__Vector_impl_data._M_start[iVar1];
    Catch::clara::std::function<void_(const_void_*,_diy::BinaryBuffer_&)>::function
              ((function<void_(const_void_*,_diy::BinaryBuffer_&)> *)&local_a0,
               &(master->blocks_).save_);
    local_80 = pvVar2;
    if (local_90 == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*local_88)(&local_a0,&local_80,&local_78);
    if (local_90 != (_Manager_type)0x0) {
      (*local_90)(&local_a0,&local_a0,__destroy_functor);
    }
    iVar1 = (int)vStack_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish -
            (int)vStack_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
    if (vStack_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start ==
        vStack_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      iVar1 = 0;
    }
    MPI_Send(vStack_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start,iVar1,&ompi_mpi_byte,move_info->dst_proc,0,
             (master->comm_).comm_.data);
    iVar1 = Master::lid(master,move_info->move_gid);
    pLVar3 = (master->links_).super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
             super__Vector_impl_data._M_start[iVar1];
    (**(pLVar3->super_Factory<diy::Link>)._vptr_Factory)(&local_a0,pLVar3);
    local_80 = (void *)local_a0._8_8_;
    (*local_78._vptr_BinaryBuffer[2])(&local_78,&local_80,8);
    (*local_78._vptr_BinaryBuffer[2])(&local_78,local_a0._M_unused._M_object,local_80);
    if ((_Manager_type *)local_a0._M_unused._0_8_ != &local_90) {
      operator_delete(local_a0._M_unused._M_object,(ulong)(local_90 + 1));
    }
    (*(pLVar3->super_Factory<diy::Link>)._vptr_Factory[4])(pLVar3,&local_78);
    iVar1 = (int)vStack_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish -
            (int)vStack_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
    if (vStack_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start ==
        vStack_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      iVar1 = 0;
    }
    MPI_Send(vStack_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start,iVar1,&ompi_mpi_byte,move_info->dst_proc,0,
             (master->comm_).comm_.data);
    iVar1 = Master::lid(master,move_info->move_gid);
    Catch::clara::std::function<void_(void_*)>::function
              ((function<void_(void_*)> *)&local_a0,&(master->blocks_).destroy_);
    local_80 = Master::release(master,iVar1);
    if (local_90 == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*local_88)(&local_a0,&local_80,extraout_RDX);
    if (local_90 != (_Manager_type)0x0) {
      (*local_90)(&local_a0,&local_a0,__destroy_functor);
    }
  }
  else {
    if (iVar1 != move_info->dst_proc) {
      return;
    }
    local_78._vptr_BinaryBuffer = (_func_int **)&PTR__MemoryBuffer_001c2738;
    local_70 = 0;
    vStack_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    vStack_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    vStack_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_50 = 0;
    vStack_48.super__Vector_base<diy::BinaryBlob,_std::allocator<diy::BinaryBlob>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    vStack_48.super__Vector_base<diy::BinaryBlob,_std::allocator<diy::BinaryBlob>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_48.super__Vector_base<diy::BinaryBlob,_std::allocator<diy::BinaryBlob>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __x = &master->blocks_;
    Catch::clara::std::function<void_*()>::function((function<void_*()> *)&local_a0,&__x->create_);
    if (local_90 == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    pvVar2 = (void *)(*local_88)(&local_a0,(void **)__x,extraout_RDX_00);
    if (local_90 != (_Manager_type)0x0) {
      (*local_90)(&local_a0,&local_a0,__destroy_functor);
    }
    mpi::detail::recv<char>
              ((status *)&local_a0,(master->comm_).comm_.data,move_info->src_proc,0,&vStack_68);
    Catch::clara::std::function<void_(void_*,_diy::BinaryBuffer_&)>::function
              ((function<void_(void_*,_diy::BinaryBuffer_&)> *)&local_a0,&(master->blocks_).load_);
    local_80 = pvVar2;
    if (local_90 == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*local_88)(&local_a0,&local_80,&local_78);
    if (local_90 != (_Manager_type)0x0) {
      (*local_90)(&local_a0,&local_a0,__destroy_functor);
    }
    mpi::detail::recv<char>
              ((status *)&local_a0,(master->comm_).comm_.data,move_info->src_proc,0,&vStack_68);
    pLVar3 = LinkFactory::load(&local_78);
    Master::add(master,move_info->move_gid,pvVar2,pLVar3);
  }
  local_78._vptr_BinaryBuffer = (_func_int **)&PTR__MemoryBuffer_001c2738;
  Catch::clara::std::vector<diy::BinaryBlob,_std::allocator<diy::BinaryBlob>_>::~vector(&vStack_48);
  if (vStack_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(vStack_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)vStack_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)vStack_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

inline void move_block(diy::Master&            master,
                const MoveInfo&         move_info)
{
    // sanity check that source and destination are different
    if (move_info.src_proc == move_info.dst_proc)
    {
        fmt::print(stderr, "Error: move_block(): source and destination are same. This should not happen.\n");
        abort();
    }

    if (master.communicator().rank() == move_info.src_proc)
    {
        diy::MemoryBuffer bb;

        // move the block from src to dst proc
        void* send_b = master.block(master.lid(move_info.move_gid));
        master.saver()(send_b, bb);
        master.communicator().send(move_info.dst_proc, 0, bb.buffer);

        // move the link for the moving block
        diy::Link* send_link = master.link(master.lid(move_info.move_gid));
        diy::LinkFactory::save(bb, send_link);
        master.communicator().send(move_info.dst_proc, 0, bb.buffer);

        // remove the block from the master
        int move_lid = master.lid(move_info.move_gid);
        master.destroyer()(master.release(move_lid));
    }
    else if (master.communicator().rank() == move_info.dst_proc)
    {
        diy::MemoryBuffer bb;

        // move the block from src to dst proc
        void* recv_b = master.creator()();
        master.communicator().recv(move_info.src_proc, 0, bb.buffer);
        master.loader()(recv_b, bb);

        // move the link for the moving block
        diy::Link* recv_link;
        master.communicator().recv(move_info.src_proc, 0, bb.buffer);
        recv_link = diy::LinkFactory::load(bb);

        // add the block to the master
        master.add(move_info.move_gid, recv_b, recv_link);
    }
}